

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O0

void __thiscall
cnn::Model::load<boost::archive::text_iarchive>(Model *this,text_iarchive *ar,uint param_3)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference ppPVar4;
  interface_iarchive<boost::archive::text_iarchive> *in_RSI;
  long in_RDI;
  LookupParameters *p_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *__range2_1;
  Parameters *p;
  iterator __end2;
  iterator __begin2;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *__range2;
  uint i_1;
  uint i;
  int nlp;
  int np;
  Parameters *in_stack_ffffffffffffff48;
  interface_iarchive<boost::archive::text_iarchive> *in_stack_ffffffffffffff50;
  __normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
  local_60;
  long local_58;
  Parameters *local_50;
  Parameters *local_48;
  Parameters **local_40;
  __normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  local_38;
  long local_30;
  uint local_24;
  uint local_20;
  int local_1c;
  int local_18;
  interface_iarchive<boost::archive::text_iarchive> *local_10;
  
  local_10 = in_RSI;
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
            (in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
            (in_stack_ffffffffffffff50,(int *)in_stack_ffffffffffffff48);
  sVar2 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::size
                    ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                     (in_RDI + 0x18));
  if (local_18 != (int)sVar2) {
    __assert_fail("np == (int)params.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                  ,0x89,
                  "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
                 );
  }
  sVar2 = std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::size
                    ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
                     (in_RDI + 0x30));
  if (local_1c == (int)sVar2) {
    local_20 = 0;
    while( true ) {
      uVar3 = (ulong)local_20;
      sVar2 = std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::size
                        ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                         (in_RDI + 0x18));
      if (sVar2 <= uVar3) break;
      std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::operator[]
                ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)(in_RDI + 0x18),
                 (ulong)local_20);
      boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      local_20 = local_20 + 1;
    }
    local_24 = 0;
    while( true ) {
      uVar3 = (ulong)local_24;
      sVar2 = std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::size
                        ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                          *)(in_RDI + 0x30));
      if (sVar2 <= uVar3) break;
      in_stack_ffffffffffffff50 = local_10;
      std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::operator[]
                ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
                 (in_RDI + 0x30),(ulong)local_24);
      boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
                (in_stack_ffffffffffffff50,(LookupParameters *)in_stack_ffffffffffffff48);
      local_24 = local_24 + 1;
    }
    std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::clear
              ((vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *)0x4dbbc5);
    local_30 = in_RDI + 0x18;
    local_38._M_current =
         (Parameters **)
         std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::begin
                   ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                    in_stack_ffffffffffffff48);
    local_40 = (Parameters **)
               std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::end
                         ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)
                          in_stack_ffffffffffffff48);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                          *)in_stack_ffffffffffffff50,
                         (__normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                          *)in_stack_ffffffffffffff48);
      if (!bVar1) break;
      ppPVar4 = __gnu_cxx::
                __normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                ::operator*(&local_38);
      local_50 = *ppPVar4;
      local_48 = local_50;
      std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::push_back
                ((vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *)
                 in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
      __gnu_cxx::
      __normal_iterator<cnn::Parameters_**,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
      ::operator++(&local_38);
    }
    local_58 = in_RDI + 0x30;
    local_60._M_current =
         (LookupParameters **)
         std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::begin
                   ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
                    in_stack_ffffffffffffff48);
    std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::end
              ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
               in_stack_ffffffffffffff48);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                          *)in_stack_ffffffffffffff50,
                         (__normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                          *)in_stack_ffffffffffffff48);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
      ::operator*(&local_60);
      std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::push_back
                ((vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *)
                 in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
      __gnu_cxx::
      __normal_iterator<cnn::LookupParameters_**,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
      ::operator++(&local_60);
    }
    return;
  }
  __assert_fail("nlp == (int)lookup_params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                ,0x8a,
                "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
               );
}

Assistant:

void load(Archive& ar, const unsigned int) {
    int np, nlp;
    ar & np;
    ar & nlp;
    assert(np == (int)params.size());
    assert(nlp == (int)lookup_params.size());
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
    all_params.clear();
    for (auto p : params) all_params.push_back(p);
    for (auto p : lookup_params) all_params.push_back(p);
  }